

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O0

void __thiscall Constraint::Constraint(Constraint *this,int indexInTuple,string *value)

{
  string *value_local;
  int indexInTuple_local;
  Constraint *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->indexInTuple = indexInTuple;
  std::__cxx11::string::operator=((string *)this,(string *)value);
  this->ind = -1;
  return;
}

Assistant:

Constraint::Constraint(int indexInTuple,string value)
{
 this->indexInTuple = indexInTuple;
 val = value;
 ind = -1;
}